

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O2

int read_and_check_crc(spng_ctx *ctx)

{
  uint uVar1;
  uint32_t uVar2;
  
  uVar1 = read_data(ctx,4);
  if (uVar1 == 0) {
    uVar2 = read_u32(ctx->data);
    (ctx->current_chunk).crc = uVar2;
    uVar1 = 0;
    if (((ctx->field_0xcc & 0x80) == 0) && (ctx->cur_actual_crc != uVar2)) {
      if (((ctx->current_chunk).type[0] & 0x20) == 0) {
        uVar1 = 0x12;
        if (ctx->crc_action_critical == 2) {
          uVar1 = 0;
        }
      }
      else {
        uVar1 = 0;
        if (ctx->crc_action_ancillary != 2) {
          uVar1 = -(uint)(ctx->crc_action_ancillary == 1) | 0x12;
        }
      }
    }
  }
  return uVar1;
}

Assistant:

static inline int read_and_check_crc(spng_ctx *ctx)
{
    if(ctx == NULL) return SPNG_EINTERNAL;

    int ret;
    ret = read_data(ctx, 4);
    if(ret) return ret;

    ctx->current_chunk.crc = read_u32(ctx->data);

    if(ctx->skip_crc) return 0;

    if(ctx->cur_actual_crc != ctx->current_chunk.crc)
    {
        if(is_critical_chunk(&ctx->current_chunk))
        {
            if(ctx->crc_action_critical == SPNG_CRC_USE) return 0;
        }
        else
        {
            if(ctx->crc_action_ancillary == SPNG_CRC_USE) return 0;
            if(ctx->crc_action_ancillary == SPNG_CRC_DISCARD) return -SPNG_CRC_DISCARD;
        }

        return SPNG_ECHUNK_CRC;
    }

    return 0;
}